

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O2

void __thiscall jbcoin::ValidatorKeys::writeToFile(ValidatorKeys *this,path *keyFile)

{
  bool bVar1;
  char *value;
  Value *pVVar2;
  runtime_error *prVar3;
  PublicKey *in_RCX;
  Value jv;
  string local_250;
  error_code ec;
  ofstream o;
  size_type local_218;
  byte abStack_200 [480];
  
  Json::Value::Value(&jv,nullValue);
  value = to_string(this->keyType_);
  Json::Value::Value((Value *)&o,value);
  pVVar2 = Json::Value::operator[](&jv,"key_type");
  Json::Value::operator=(pVVar2,(Value *)&o);
  Json::Value::~Value((Value *)&o);
  toBase58_abi_cxx11_((string *)&o,(jbcoin *)0x1c,(int)this + 8,in_RCX);
  Json::Value::Value((Value *)&local_250,(string *)&o);
  pVVar2 = Json::Value::operator[](&jv,"public_key");
  Json::Value::operator=(pVVar2,(Value *)&local_250);
  Json::Value::~Value((Value *)&local_250);
  std::__cxx11::string::~string((string *)&o);
  toBase58_abi_cxx11_((string *)&o,(jbcoin *)&DAT_00000020,(int)this + 0x38,(SecretKey *)in_RCX);
  Json::Value::Value((Value *)&local_250,(string *)&o);
  pVVar2 = Json::Value::operator[](&jv,"secret_key");
  Json::Value::operator=(pVVar2,(Value *)&local_250);
  Json::Value::~Value((Value *)&local_250);
  std::__cxx11::string::~string((string *)&o);
  Json::Value::Value((Value *)&o,this->tokenSequence_);
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::operator=(pVVar2,(Value *)&o);
  Json::Value::~Value((Value *)&o);
  Json::Value::Value((Value *)&o,this->revoked_);
  pVVar2 = Json::Value::operator[](&jv,"revoked");
  Json::Value::operator=(pVVar2,(Value *)&o);
  Json::Value::~Value((Value *)&o);
  boost::filesystem::path::parent_path();
  std::__cxx11::string::~string((string *)&o);
  if (local_218 != 0) {
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
    boost::filesystem::path::parent_path();
    bVar1 = boost::filesystem::exists((path *)&o);
    std::__cxx11::string::~string((string *)&o);
    if (!bVar1) {
      boost::filesystem::path::parent_path();
      boost::filesystem::create_directories((path *)&o,&ec);
      std::__cxx11::string::~string((string *)&o);
    }
    if (ec.failed_ == false) {
      boost::filesystem::path::parent_path();
      bVar1 = boost::filesystem::is_directory((path *)&o);
      std::__cxx11::string::~string((string *)&o);
      if (bVar1) goto LAB_001bf24c;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    boost::filesystem::path::parent_path();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o,
                   "Cannot create directory: ",&local_250);
    std::runtime_error::runtime_error(prVar3,(string *)&o);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001bf24c:
  std::ofstream::ofstream(&o,(string *)keyFile,_S_trunc);
  if ((abStack_200[*(long *)(_o + -0x18)] & 5) == 0) {
    Json::Value::toStyledString_abi_cxx11_(&local_250,&jv);
    std::operator<<((ostream *)&o,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::ofstream::~ofstream(&o);
    Json::Value::~Value(&jv);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"Cannot open key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
  std::runtime_error::runtime_error(prVar3,(string *)&local_250);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
ValidatorKeys::writeToFile (
    boost::filesystem::path const& keyFile) const
{
    using namespace boost::filesystem;

    Json::Value jv;
    jv["key_type"] = to_string(keyType_);
    jv["public_key"] = toBase58(TOKEN_NODE_PUBLIC, publicKey_);
    jv["secret_key"] = toBase58(TOKEN_NODE_PRIVATE, secretKey_);
    jv["token_sequence"] = Json::UInt (tokenSequence_);
    jv["revoked"] = revoked_;

    if (! keyFile.parent_path().empty())
    {
        boost::system::error_code ec;
        if (! exists (keyFile.parent_path()))
            boost::filesystem::create_directories(keyFile.parent_path(), ec);

        if (ec || ! is_directory (keyFile.parent_path()))
            throw std::runtime_error ("Cannot create directory: " +
                    keyFile.parent_path().string());
    }

    std::ofstream o (keyFile.string (), std::ios_base::trunc);
    if (o.fail())
        throw std::runtime_error ("Cannot open key file: " +
            keyFile.string());

    o << jv.toStyledString();
}